

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree_test.cpp
# Opt level: O0

void __thiscall
LazySegtree_BenchmarkN100000Q100000_Test::TestBody(LazySegtree_BenchmarkN100000Q100000_Test *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ll rhs;
  char *message;
  AssertHelper local_a8;
  Message local_a0;
  undefined1 local_98 [8];
  AssertionResult gtest_ar;
  ll val;
  int to_1;
  int fr_1;
  int to;
  int fr;
  int qi;
  ll tot;
  Segtree tree;
  int margin;
  int q;
  int n;
  LazySegtree_BenchmarkN100000Q100000_Test *this_local;
  
  tree.rson._4_4_ = 0x32;
  Segtree::Segtree((Segtree *)&tot,0,100000);
  _fr = (_Alloc_hider *)0x0;
  for (to = 0; to < 100000; to = to + 1) {
    if (to % 2 == 0) {
      iVar2 = rand();
      iVar2 = iVar2 % tree.rson._4_4_;
      iVar3 = rand();
      Segtree::rangeQuery((Segtree *)&tot,iVar2,100000 - iVar3 % tree.rson._4_4_);
    }
    else {
      iVar2 = rand();
      iVar2 = iVar2 % tree.rson._4_4_;
      iVar3 = rand();
      iVar3 = iVar3 % tree.rson._4_4_;
      iVar4 = rand();
      gtest_ar.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (long)(iVar4 % 1000000);
      _fr = &(gtest_ar.message_.ptr_)->_M_dataplus + (long)_fr;
      Segtree::rangeUpdate((Segtree *)&tot,iVar2,100000 - iVar3,(ll)gtest_ar.message_.ptr_);
    }
  }
  rhs = Segtree::rangeQuery((Segtree *)&tot,50000,0xc351);
  testing::internal::EqHelper<false>::Compare
            ((EqHelper<false> *)local_98,"tot","tree.rangeQuery(n/2, n/2+1)",(BiggestInt)_fr,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_a0);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              (&local_a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trinerdi[P]icpc-notebook/src/trinerdi/data-structures/lazy_segtree_test.cpp"
               ,0x5b,message);
    testing::internal::AssertHelper::operator=(&local_a8,&local_a0);
    testing::internal::AssertHelper::~AssertHelper(&local_a8);
    testing::Message::~Message(&local_a0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  Segtree::~Segtree((Segtree *)&tot);
  return;
}

Assistant:

TEST(LazySegtree, BenchmarkN100000Q100000) {
    int n = 100000;
    int q = 100000;
    int margin = 50;

    Segtree tree(0,n);
    ll tot = 0;
    rep(qi, 0, q) {
        if (qi % 2 == 0) {
            int fr = rand() % margin;
            int to = n - rand() % margin;
            tree.rangeQuery(fr, to);
        } else {
            int fr = rand() % margin;
            int to = n - rand() % margin;
            ll val = rand() % 1000000;
            tot += val;
            tree.rangeUpdate(fr, to, val);
        }
    }
    EXPECT_EQ(tot, tree.rangeQuery(n/2, n/2+1));
}